

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O3

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0>::
     spinlocking_heterogeneous_queue_try_put_samples(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int *piVar3;
  char *pcVar4;
  put_transaction<int> put;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_1;
  runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_4;
  runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type_3;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  queue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  put_transaction<int> local_150;
  runtime_type local_128;
  put_transaction<void> local_120;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  local_100;
  
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p._0_4_ = 0xc;
  bVar2 = density::
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
          ::try_emplace<int,int>
                    ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
                      *)&local_100,progress_wait_free,(int *)&local_170);
  paVar1 = &local_170.field_2;
  if (bVar2) {
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hello world!!","");
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::try_emplace<std::__cxx11::string,std::__cxx11::string>
              ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_100,progress_wait_free,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  bVar2 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
          ::try_emplace<int>(&local_100,progress_wait_free);
  if (bVar2) {
    local_170._M_dataplus._M_p._0_4_ = 0xc;
    local_150.m_put.m_control_block =
         (LfQueueControl *)CONCAT71(local_150.m_put.m_control_block._1_7_,0x2d);
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::try_emplace<std::__cxx11::string,int,char>
              ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
                *)&local_100,progress_wait_free,(int *)&local_170,(char *)&local_150);
  }
  local_120.m_put.m_control_block =
       (LfQueueControl *)CONCAT44(local_120.m_put.m_control_block._4_4_,0xc);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::try_start_emplace<int,int>
            ((put_transaction<int> *)&local_170,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_100,progress_wait_free,(int *)&local_120);
  local_150.m_put.m_control_block = (LfQueueControl *)local_170._M_dataplus._M_p;
  local_150.m_put.m_next_ptr = local_170._M_string_length;
  local_150.m_put.m_user_storage = (void *)local_170.field_2._M_allocated_capacity;
  local_150.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        *)local_170.field_2._8_8_;
  local_170.field_2._M_allocated_capacity = 0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction((put_transaction<int> *)&local_170);
  local_170._M_dataplus._M_p = (pointer)local_150.m_put.m_control_block;
  local_170._M_string_length = local_150.m_put.m_next_ptr;
  local_170.field_2._M_allocated_capacity = (size_type)local_150.m_put.m_user_storage;
  local_170.field_2._8_8_ = local_150.m_queue;
  local_150.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_150);
  if (local_170.field_2._M_allocated_capacity != 0) {
    piVar3 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                    ::put_transaction<int>::element_ptr((put_transaction<int> *)&local_170);
    *piVar3 = *piVar3 + 2;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<int>::commit((put_transaction<int> *)&local_170);
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction((put_transaction<int> *)&local_170);
  local_120.m_put.m_control_block =
       (LfQueueControl *)CONCAT44(local_120.m_put.m_control_block._4_4_,4);
  local_128.m_feature_table._0_1_ = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::try_start_emplace<std::__cxx11::string,int,char>
            ((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_150,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_100,progress_wait_free,(int *)&local_120,(char *)&local_128);
  local_170._M_dataplus._M_p = (pointer)local_150.m_put.m_control_block;
  local_170._M_string_length = local_150.m_put.m_next_ptr;
  local_170.field_2._M_allocated_capacity = (size_type)local_150.m_put.m_user_storage;
  local_170.field_2._8_8_ = local_150.m_queue;
  local_150.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_150);
  if (local_170.field_2._M_allocated_capacity != 0) {
    pcVar4 = (char *)density::
                     sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     ::
                     put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::element_ptr((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_170);
    std::__cxx11::string::append(pcVar4);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::
    put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_170);
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction((put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_170);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p =
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_dyn_push((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                  *)&local_100,progress_wait_free,(runtime_type *)&local_170);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hello world!!","");
  local_150.m_put.m_control_block =
       (LfQueueControl *)
       density::detail::
       FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_dyn_push_copy((sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                       *)&local_100,progress_wait_free,(runtime_type *)&local_150,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hello world!!","");
  local_150.m_put.m_control_block =
       (LfQueueControl *)
       density::detail::
       FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_dyn_push_move((sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                       *)&local_100,progress_wait_free,(runtime_type *)&local_150,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_120.m_put.m_control_block =
       (LfQueueControl *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_destroy,density::f_size,density::f_alignment>,int>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_start_dyn_push
            ((put_transaction<void> *)&local_150,
             (sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100,progress_wait_free,(runtime_type *)&local_120);
  local_170._M_dataplus._M_p = (pointer)local_150.m_put.m_control_block;
  local_170._M_string_length = local_150.m_put.m_next_ptr;
  local_170.field_2._M_allocated_capacity = (size_type)local_150.m_put.m_user_storage;
  local_170.field_2._8_8_ = local_150.m_queue;
  local_150.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_150);
  if (local_170.field_2._M_allocated_capacity != 0) {
    density::
    sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<void>::commit((put_transaction<void> *)&local_170);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_170);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hello world!!","");
  local_128.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_start_dyn_push_copy
            (&local_120,
             (sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100,progress_wait_free,&local_128,&local_170);
  local_150.m_put.m_control_block = local_120.m_put.m_control_block;
  local_150.m_put.m_next_ptr = local_120.m_put.m_next_ptr;
  local_150.m_put.m_user_storage = local_120.m_put.m_user_storage;
  local_150.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        *)local_120.m_queue;
  local_120.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_120);
  if (local_150.m_put.m_user_storage != (void *)0x0) {
    density::
    sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<void>::commit((put_transaction<void> *)&local_150);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_tail = 0xffc0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.
  super_LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
  .m_head = (ControlBlock *)0x0;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Hello world!!","");
  local_128.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_move_construct,density::f_destroy,density::f_size,density::f_alignment>,std::__cxx11::string>
       ::s_table;
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::try_start_dyn_push_move
            ((put_transaction<void> *)&local_120,
             (sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100,progress_wait_free,(runtime_type *)&local_128,&local_170);
  local_150.m_put.m_control_block = local_120.m_put.m_control_block;
  local_150.m_put.m_next_ptr = local_120.m_put.m_next_ptr;
  local_150.m_put.m_user_storage = local_120.m_put.m_user_storage;
  local_150.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
        *)local_120.m_queue;
  local_120.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_120);
  if (local_150.m_put.m_user_storage != (void *)0x0) {
    density::
    sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::put_transaction<void>::commit((put_transaction<void> *)&local_150);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction((put_transaction<void> *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  return;
}

Assistant:

static void spinlocking_heterogeneous_queue_try_put_samples()
{
    using namespace density;

    {
        sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        {
            //! [sp_heter_queue try_push example 1]
            bool successful = false;
            if (queue.try_push(progress_wait_free, 12))
            {
                successful = queue.try_push(progress_wait_free, std::string("Hello world!!"));
            }
            //! [sp_heter_queue try_push example 1]
            (void)successful;
        }
        {
            //! [sp_heter_queue try_emplace example 1]
            bool successful = false;
            if (queue.template try_emplace<int>(progress_wait_free))
            {
                successful = queue.template try_emplace<std::string>(progress_wait_free, 12, '-');
            }
            //! [sp_heter_queue try_emplace example 1]
            (void)successful;
        }
        {
            //! [sp_heter_queue try_start_push example 1]
            if (auto put = queue.try_start_push(progress_wait_free, 12))
            {
                // ..
                put.element() += 2;
                put.commit(); // commits a 14
            }
            //! [sp_heter_queue try_start_push example 1]
        }
        {
            //! [sp_heter_queue try_start_emplace example 1]
            if (
              auto put = queue.template try_start_emplace<std::string>(progress_wait_free, 4, '*'))
            {
                // ..
                put.element() += "****";
                put.commit(); // commits a "********"
            }
            //! [sp_heter_queue try_start_emplace example 1]
        }
    }
    {
        //! [sp_heter_queue try_dyn_push example 1]
        using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        auto const type = MyRunTimeType::make<int>();
        if (queue.try_dyn_push(progress_wait_free, type)) // appends 0
        {
            // ...
        }
        //! [sp_heter_queue try_dyn_push example 1]
    }
    {
        //! [sp_heter_queue try_dyn_push_copy example 1]
        using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        std::string const source("Hello world!!");
        auto const        type = MyRunTimeType::make<decltype(source)>();
        if (queue.try_dyn_push_copy(progress_wait_free, type, &source))
        {
            // ...
        }
        //! [sp_heter_queue try_dyn_push_copy example 1]
    }
    {
        //! [sp_heter_queue try_dyn_push_move example 1]
        using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        std::string source("Hello world!!");
        auto const  type = MyRunTimeType::make<decltype(source)>();
        if (queue.try_dyn_push_move(progress_wait_free, type, &source))
        {
            // ...
        }
        //! [sp_heter_queue try_dyn_push_move example 1]
    }

    {
        //! [sp_heter_queue try_start_dyn_push example 1]
        using MyRunTimeType = runtime_type<f_default_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        auto const type = MyRunTimeType::make<int>();
        if (auto put = queue.try_start_dyn_push(progress_wait_free, type))
        {
            // ....
            put.commit();
        }
        //! [sp_heter_queue try_start_dyn_push example 1]
    }
    {
        //! [sp_heter_queue try_start_dyn_push_copy example 1]
        using MyRunTimeType = runtime_type<f_copy_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        std::string const source("Hello world!!");
        auto const        type = MyRunTimeType::make<decltype(source)>();
        if (auto put = queue.try_start_dyn_push_copy(progress_wait_free, type, &source))
        {
            // ...
            put.commit();
        }
        //! [sp_heter_queue try_start_dyn_push_copy example 1]
    }
    {
        //! [sp_heter_queue try_start_dyn_push_move example 1]
        using MyRunTimeType = runtime_type<f_move_construct, f_destroy, f_size, f_alignment>;
        sp_heter_queue<MyRunTimeType, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
          queue;

        std::string source("Hello world!!");
        auto const  type = MyRunTimeType::make<decltype(source)>();
        if (auto put = queue.try_start_dyn_push_move(progress_wait_free, type, &source))
        {
            // ..
            put.commit();
        }
        //! [sp_heter_queue try_start_dyn_push_move example 1]
    }
}